

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

void sha256_Raw(sha2_byte *data,size_t len,uint8_t *digest)

{
  SHA256_CTX context;
  SHA256_CTX local_88;
  
  local_88.state[4] = 0x510e527f;
  local_88.state[5] = 0x9b05688c;
  local_88.state[6] = 0x1f83d9ab;
  local_88.state[7] = 0x5be0cd19;
  local_88.state[0] = 0x6a09e667;
  local_88.state[1] = 0xbb67ae85;
  local_88.state[2] = 0x3c6ef372;
  local_88.state[3] = 0xa54ff53a;
  memzero(local_88.buffer,0x40);
  local_88.bitcount = 0;
  sha256_Update(&local_88,data,len);
  sha256_Final(&local_88,digest);
  return;
}

Assistant:

void sha256_Raw(const sha2_byte* data, size_t len, uint8_t digest[SHA256_DIGEST_LENGTH]) {
    trezor::SHA256_CTX	context;
	sha256_Init(&context);
	sha256_Update(&context, data, len);
	sha256_Final(&context, digest);
}